

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_sbar.cpp
# Opt level: O0

void __thiscall DBaseStatusBar::DrawConsistancy(DBaseStatusBar *this)

{
  FFont *font;
  DFrameBuffer *this_00;
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *local_60;
  char *buff_p;
  char conbuff [64];
  int i;
  DBaseStatusBar *this_local;
  
  if (netgame) {
    local_60 = (char *)0x0;
    conbuff[0x3c] = '\0';
    conbuff[0x3d] = '\0';
    conbuff[0x3e] = '\0';
    conbuff[0x3f] = '\0';
    for (; (int)conbuff._60_4_ < 8; conbuff._60_4_ = conbuff._60_4_ + 1) {
      if (((playeringame[(int)conbuff._60_4_] & 1U) != 0) &&
         (*(short *)(&DAT_01ae71b2 + (long)(int)conbuff._60_4_ * 0x2a0) != 0)) {
        if (local_60 == (char *)0x0) {
          strcpy((char *)&buff_p,"Out of sync with:");
          local_60 = conbuff + 9;
        }
        pcVar3 = local_60 + 1;
        *local_60 = ' ';
        local_60 = local_60 + 2;
        *pcVar3 = (char)conbuff._60_4_ + '1';
        *local_60 = '\0';
      }
    }
    if (local_60 != (char *)0x0) {
      if (((DrawConsistancy::firsttime & 1U) != 0) &&
         (DrawConsistancy::firsttime = false, debugfile != (FILE *)0x0)) {
        fprintf((FILE *)debugfile,"%s as of tic %d (%d)\n",&buff_p,
                (ulong)(uint)(int)*(short *)(&DAT_01ae71b2 + (long)(1 - consoleplayer) * 0x2a0));
      }
      this_00 = screen;
      font = SmallFont;
      iVar1 = DCanvas::GetWidth((DCanvas *)screen);
      iVar2 = FFont::StringWidth(SmallFont,(char *)&buff_p);
      DCanvas::DrawText((DCanvas *)this_00,font,3,(iVar1 - iVar2 * CleanXfac) / 2,0,(char *)&buff_p,
                        0x40001393,1,0);
      BorderTopRefresh =
           (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x20])();
    }
  }
  return;
}

Assistant:

void DBaseStatusBar::DrawConsistancy () const
{
	static bool firsttime = true;
	int i;
	char conbuff[64], *buff_p;

	if (!netgame)
		return;

	buff_p = NULL;
	for (i = 0; i < MAXPLAYERS; i++)
	{
		if (playeringame[i] && players[i].inconsistant)
		{
			if (buff_p == NULL)
			{
				strcpy (conbuff, "Out of sync with:");
				buff_p = conbuff + 17;
			}
			*buff_p++ = ' ';
			*buff_p++ = '1' + i;
			*buff_p = 0;
		}
	}

	if (buff_p != NULL)
	{
		if (firsttime)
		{
			firsttime = false;
			if (debugfile)
			{
				fprintf (debugfile, "%s as of tic %d (%d)\n", conbuff,
					players[1-consoleplayer].inconsistant,
					players[1-consoleplayer].inconsistant/ticdup);
			}
		}
		screen->DrawText (SmallFont, CR_GREEN, 
			(screen->GetWidth() - SmallFont->StringWidth (conbuff)*CleanXfac) / 2,
			0, conbuff, DTA_CleanNoMove, true, TAG_DONE);
		BorderTopRefresh = screen->GetPageCount ();
	}
}